

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_tools.cxx
# Opt level: O0

void __thiscall
db_unpacker::extract_2215(db_unpacker *this,string *prefix,string *mask,xr_reader *s,uint8_t *data)

{
  undefined8 fs_00;
  bool bVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  uint32_t local_70;
  uint32_t local_6c;
  uint size_compressed;
  uint size_real;
  uint offset;
  undefined1 local_58 [8];
  string path;
  xr_file_system *fs;
  uint8_t *data_local;
  xr_reader *s_local;
  string *mask_local;
  string *prefix_local;
  db_unpacker *this_local;
  
  path.field_2._8_8_ = xray_re::xr_file_system::instance();
  std::__cxx11::string::string((string *)local_58);
  while (bVar1 = xray_re::xr_reader::eof(s), ((bVar1 ^ 0xffU) & 1) != 0) {
    xray_re::xr_reader::r_sz(s,(string *)local_58);
    size_compressed = xray_re::xr_reader::r_u32(s);
    local_6c = xray_re::xr_reader::r_u32(s);
    local_70 = xray_re::xr_reader::r_u32(s);
    lVar2 = std::__cxx11::string::length();
    if (((lVar2 == 0) || (size_compressed == 0)) ||
       (lVar2 = std::__cxx11::string::find((string *)local_58,(ulong)mask), lVar2 != -1)) {
      fs_00 = path.field_2._8_8_;
      if (size_compressed == 0) {
        std::operator+(&local_90,prefix,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                      );
        xray_re::xr_file_system::create_folder((xr_file_system *)fs_00,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
      }
      else {
        std::operator+(&local_b0,prefix,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                      );
        write_file((xr_file_system *)fs_00,&local_b0,data + size_compressed,local_6c,local_70);
        std::__cxx11::string::~string((string *)&local_b0);
      }
    }
  }
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

void db_unpacker::extract_2215(const std::string& prefix, const std::string& mask, xr_reader* s, const uint8_t* data) const
{
	xr_file_system& fs = xr_file_system::instance();
	for (std::string path; !s->eof(); ) {
		s->r_sz(path);
		unsigned offset = s->r_u32();
		unsigned size_real = s->r_u32();
		unsigned size_compressed = s->r_u32();

		if (mask.length() && (offset != 0))
		//if (path.compare(path.size()-mask.size(),mask.size(),mask) != 0)
		if (path.find(mask) == -1)
		continue;

		if (DB_DEBUG && fs.read_only()) {
			msg("%s", path.c_str());
			msg("  offset: %u", offset);
			msg("  size (real): %u", size_real);
			msg("  size (compressed): %u", size_compressed);
		} else if (offset == 0) {
			fs.create_folder(prefix + path);
		} else {
			write_file(fs, prefix + path, data + offset, size_real, size_compressed);
		}
	}
}